

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

void __thiscall
aeron::ClientConductor::onAvailableCounter
          (ClientConductor *this,int64_t registrationId,int32_t counterId)

{
  _Atomic_word *p_Var1;
  pointer pCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  int iVar4;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Counter *__tmp;
  pointer pCVar6;
  long lVar7;
  long lVar8;
  pointer __args_2;
  undefined1 local_4d;
  int32_t local_4c;
  __weak_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2> local_48;
  ClientConductor *local_38;
  
  local_4c = counterId;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  pCVar6 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)pCVar2 - (long)pCVar6;
  lVar7 = (lVar8 >> 5) * -0x5555555555555555 >> 2;
  if (0 < lVar7) {
    lVar8 = lVar7 + 1;
    __args_2 = pCVar6 + 2;
    do {
      if (__args_2[-2].m_registrationId == registrationId) {
        __args_2 = __args_2 + -2;
        goto LAB_001416e8;
      }
      if (__args_2[-1].m_registrationId == registrationId) {
        __args_2 = __args_2 + -1;
        goto LAB_001416e8;
      }
      if (__args_2->m_registrationId == registrationId) goto LAB_001416e8;
      if (__args_2[1].m_registrationId == registrationId) {
        __args_2 = __args_2 + 1;
        goto LAB_001416e8;
      }
      lVar8 = lVar8 + -1;
      __args_2 = __args_2 + 4;
    } while (1 < lVar8);
    lVar8 = (long)pCVar2 - (long)(pCVar6 + lVar7 * 4);
    pCVar6 = pCVar6 + lVar7 * 4;
  }
  lVar7 = (lVar8 >> 5) * -0x5555555555555555;
  if (lVar7 == 1) {
LAB_001416c9:
    __args_2 = pCVar6;
    if (pCVar6->m_registrationId != registrationId) {
      __args_2 = pCVar2;
    }
  }
  else if (lVar7 == 2) {
LAB_001416c0:
    __args_2 = pCVar6;
    if (pCVar6->m_registrationId != registrationId) {
      pCVar6 = pCVar6 + 1;
      goto LAB_001416c9;
    }
  }
  else {
    if (lVar7 != 3) goto LAB_001417f7;
    __args_2 = pCVar6;
    if (pCVar6->m_registrationId != registrationId) {
      pCVar6 = pCVar6 + 1;
      goto LAB_001416c0;
    }
  }
LAB_001416e8:
  if ((__args_2 != pCVar2) && (__args_2->m_status == AWAITING_MEDIA_DRIVER)) {
    __args_2->m_status = REGISTERED_MEDIA_DRIVER;
    __args_2->m_counterId = counterId;
    local_48._M_ptr = (element_type *)0x0;
    local_38 = this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<aeron::Counter,std::allocator<aeron::Counter>,aeron::ClientConductor*,aeron::concurrent::AtomicBuffer&,long&,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_refcount,&local_48._M_ptr,
               (allocator<aeron::Counter> *)&local_4d,&local_38,this->m_counterValuesBuffer,
               &__args_2->m_registrationId,&local_4c);
    _Var5._M_pi = local_48._M_refcount._M_pi;
    peVar3 = local_48._M_ptr;
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__args_2->m_counterCache).super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = peVar3;
    this_00 = (__args_2->m_counterCache).
              super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (__args_2->m_counterCache).super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var5._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_refcount._M_pi);
      }
      _Var5._M_pi = (__args_2->m_counterCache).
                    super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
    }
    local_48._M_ptr =
         (__args_2->m_counterCache).super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var5._M_pi)->_M_weak_count = (_Var5._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (_Var5._M_pi)->_M_weak_count = (_Var5._M_pi)->_M_weak_count + 1;
      }
    }
    local_48._M_refcount._M_pi = _Var5._M_pi;
    std::__weak_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__args_2->m_counter).super___weak_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>,
               &local_48);
    if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_48._M_refcount._M_pi)->_M_weak_count;
        iVar4 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar4 = (local_48._M_refcount._M_pi)->_M_weak_count;
        (local_48._M_refcount._M_pi)->_M_weak_count = iVar4 + -1;
      }
      if (iVar4 == 1) {
        (*(local_48._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    counterId = local_4c;
  }
LAB_001417f7:
  local_38 = (ClientConductor *)CONCAT44(local_38._4_4_,counterId);
  local_48._M_ptr = (element_type *)registrationId;
  if ((this->m_onAvailableCounterHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*(this->m_onAvailableCounterHandler)._M_invoker)
            ((_Any_data *)&this->m_onAvailableCounterHandler,&this->m_countersReader,
             (long *)&local_48,(int *)&local_38);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onAvailableCounter(
    std::int64_t registrationId,
    std::int32_t counterId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto counterIt = std::find_if(m_counters.begin(), m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (counterIt != m_counters.end() && (*counterIt).m_status == RegistrationStatus::AWAITING_MEDIA_DRIVER)
    {
        CounterStateDefn& state = (*counterIt);

        state.m_status = RegistrationStatus::REGISTERED_MEDIA_DRIVER;
        state.m_counterId = counterId;
        state.m_counterCache = std::make_shared<Counter>(this, m_counterValuesBuffer, state.m_registrationId, counterId);
        state.m_counter = std::weak_ptr<Counter>(state.m_counterCache);
    }

    m_onAvailableCounterHandler(m_countersReader, registrationId, counterId);
}